

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSMultiValueFacet.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSMultiValueFacet::XSMultiValueFacet
          (XSMultiValueFacet *this,FACET facetKind,StringList *lexicalValues,bool isFixed,
          XSAnnotation *headAnnot,XSModel *xsModel,MemoryManager *manager)

{
  RefVectorOf<xercesc_4_0::XSAnnotation> *this_00;
  
  XSObject::XSObject(&this->super_XSObject,MULTIVALUE_FACET,xsModel,manager);
  (this->super_XSObject)._vptr_XSObject = (_func_int **)&PTR__XSMultiValueFacet_00400998;
  this->fFacetKind = facetKind;
  this->fIsFixed = isFixed;
  this->fLexicalValues = lexicalValues;
  this->fXSAnnotationList = (XSAnnotationList *)0x0;
  if (headAnnot != (XSAnnotation *)0x0) {
    this_00 = (RefVectorOf<xercesc_4_0::XSAnnotation> *)XMemory::operator_new(0x30,manager);
    RefVectorOf<xercesc_4_0::XSAnnotation>::RefVectorOf(this_00,1,false,manager);
    this->fXSAnnotationList = this_00;
    do {
      BaseRefVectorOf<xercesc_4_0::XSAnnotation>::addElement
                (&this->fXSAnnotationList->super_BaseRefVectorOf<xercesc_4_0::XSAnnotation>,
                 headAnnot);
      headAnnot = XSAnnotation::getNext(headAnnot);
    } while (headAnnot != (XSAnnotation *)0x0);
  }
  return;
}

Assistant:

XSMultiValueFacet::XSMultiValueFacet(XSSimpleTypeDefinition::FACET facetKind,
                                     StringList*                   lexicalValues,
                                     bool                          isFixed,
                                     XSAnnotation* const           headAnnot,
                                     XSModel* const                xsModel,
                                     MemoryManager* const          manager)
    : XSObject(XSConstants::MULTIVALUE_FACET, xsModel, manager)
    , fFacetKind(facetKind)
    , fIsFixed(isFixed)
    , fLexicalValues(lexicalValues)
    , fXSAnnotationList(0)
{
    if (headAnnot)
    {        
        fXSAnnotationList = new (manager) RefVectorOf<XSAnnotation>(1, false, manager);
  
        XSAnnotation* annot = headAnnot;
        do 
        {
            fXSAnnotationList->addElement(annot);
            annot = annot->getNext();
        } while (annot);
    }
}